

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O0

bool __thiscall QSlider::event(QSlider *this,QEvent *event)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QSliderPrivate *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QHoverEvent *he;
  QSliderPrivate *d;
  QEvent *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QSliderPrivate *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QSlider *)0x682eff);
  TVar3 = QEvent::type((QEvent *)in_RSI);
  if (TVar3 != StyleChange) {
    if (TVar3 - HoverEnter < 3) {
      if (in_RSI != (QSliderPrivate *)0x0) {
        QSinglePointEvent::position((QSinglePointEvent *)0x682f5c);
        QPointF::toPoint(in_RDI);
        QSliderPrivate::updateHoverControl
                  (in_RSI,(QPoint *)CONCAT44(TVar3,in_stack_ffffffffffffffb8));
      }
      goto LAB_00682f96;
    }
    if (TVar3 != MacSizeChange) goto LAB_00682f96;
  }
  QSliderPrivate::resetLayoutItemMargins(in_stack_ffffffffffffffa8);
LAB_00682f96:
  bVar2 = QAbstractSlider::event
                    ((QAbstractSlider *)
                     CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QSlider::event(QEvent *event)
{
    Q_D(QSlider);

    switch(event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d->updateHoverControl(he->position().toPoint());
        break;
    case QEvent::StyleChange:
    case QEvent::MacSizeChange:
        d->resetLayoutItemMargins();
        break;
    default:
        break;
    }
    return QAbstractSlider::event(event);
}